

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O0

void __thiscall
SudokuChain::outputSpecification
          (SudokuChain *this,
          vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
          *specifications)

{
  bool bVar1;
  ostream *poVar2;
  __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar3;
  shared_ptr<SudokuChain::SudokuSpecification> *spec;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
  *__range1;
  int i;
  vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
  *specifications_local;
  SudokuChain *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"sudoku specification: ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
           ::begin(specifications);
  spec = (shared_ptr<SudokuChain::SudokuSpecification> *)
         std::
         vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>
         ::end(specifications);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<SudokuChain::SudokuSpecification>_*,_std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>_>
                                     *)&spec), bVar1) {
    this_00 = (__shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)__gnu_cxx::
                 __normal_iterator<std::shared_ptr<SudokuChain::SudokuSpecification>_*,_std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>_>
                 ::operator*(&__end1);
    poVar2 = std::operator<<((ostream *)&std::cout,"  ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,__range1._4_4_);
    poVar2 = std::operator<<(poVar2," ");
    peVar3 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,peVar3->squared_size);
    poVar2 = std::operator<<(poVar2,"x");
    peVar3 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,peVar3->squared_size);
    poVar2 = std::operator<<(poVar2," ");
    peVar3 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    poVar2 = std::operator<<(poVar2,(string *)
                                    (Sudoku::types_abi_cxx11_ + (long)(int)peVar3->type * 0x20));
    poVar2 = std::operator<<(poVar2,", offset: (");
    peVar3 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,peVar3->offset_from_previous_x);
    poVar2 = std::operator<<(poVar2,",");
    peVar3 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,peVar3->offset_from_previous_y);
    poVar2 = std::operator<<(poVar2,") ");
    poVar2 = std::operator<<(poVar2,"starting index: ");
    peVar3 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    std::ostream::operator<<(poVar2,peVar3->firstOwnIndex);
    peVar3 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->previous);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," (previous set)");
    }
    peVar3 = std::
             __shared_ptr_access<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(this_00);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar3->next);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout," (next set)");
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<SudokuChain::SudokuSpecification>_*,_std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>,_std::allocator<std::shared_ptr<SudokuChain::SudokuSpecification>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void SudokuChain::outputSpecification(std::vector<std::shared_ptr<SudokuChain::SudokuSpecification>> specifications)
{
  std::cout<<"sudoku specification: "<<std::endl;
  int i=0;
  for(auto &spec : specifications)
  {
    std::cout<<"  "<<i<<" "<<spec->squared_size<<"x"<<spec->squared_size
      <<" "<<Sudoku::types[int(spec->type)]
      <<", offset: ("<<spec->offset_from_previous_x<<","<<spec->offset_from_previous_y<<") "
      <<"starting index: "<<spec->firstOwnIndex;
    if(spec->previous)
    {
      std::cout<<" (previous set)";
    }
    if(spec->next)
    {
      std::cout<<" (next set)";
    }
    std::cout<<std::endl;
    i++;
  }
}